

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue::~IfcPropertyReferenceValue
          (IfcPropertyReferenceValue *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].field_0x60 = 0x825678;
  *(undefined8 *)&this->field_0x48 = 0x8256f0;
  *(undefined8 *)&this[-1].field_0xb8 = 0x8256a0;
  *(undefined8 *)this = 0x8256c8;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x40 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x40);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  *(undefined8 *)&this[-1].field_0x60 = 0x825808;
  *(undefined8 *)&this->field_0x48 = 0x825830;
  if ((Out *)*(undefined1 **)&this[-1].field_0x90 != &this[-1].PropertyReference) {
    operator_delete(*(undefined1 **)&this[-1].field_0x90,
                    (ulong)((long)&(this[-1].PropertyReference.
                                    super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_DataType + 1));
  }
  puVar1 = (undefined1 *)
           this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>.
           aux_is_derived.super__Base_bitset<1UL>._M_w;
  puVar2 = &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>.
            field_0x18;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete(&this[-1].field_0x60,200);
  return;
}

Assistant:

IfcPropertyReferenceValue() : Object("IfcPropertyReferenceValue") {}